

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Sol * exampleA(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs)

{
  ride *__args;
  pointer prVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  iterator iVar9;
  vector<ride,std::allocator<ride>> *this;
  allocator_type local_11;
  
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,&local_11);
  this = (vector<ride,std::allocator<ride>> *)
         (__return_storage_ptr__->
         super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  __args = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar9._M_current = *(ride **)(this + 8);
  if (iVar9._M_current == *(ride **)(this + 0x10)) {
    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>(this,iVar9,__args);
    this = (vector<ride,std::allocator<ride>> *)
           (__return_storage_ptr__->
           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    lVar2 = __args->id;
    lVar3 = __args->s_time;
    lVar4 = __args->e_time;
    lVar5 = __args->len;
    lVar6 = (__args->start).x;
    lVar7 = (__args->start).y;
    lVar8 = (__args->end).y;
    ((iVar9._M_current)->end).x = (__args->end).x;
    ((iVar9._M_current)->end).y = lVar8;
    ((iVar9._M_current)->start).x = lVar6;
    ((iVar9._M_current)->start).y = lVar7;
    (iVar9._M_current)->e_time = lVar4;
    (iVar9._M_current)->len = lVar5;
    (iVar9._M_current)->id = lVar2;
    (iVar9._M_current)->s_time = lVar3;
    *(long *)(this + 8) = *(long *)(this + 8) + 0x40;
  }
  prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar9._M_current = *(ride **)(this + 0x20);
  if (iVar9._M_current == *(ride **)(this + 0x28)) {
    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
              (this + 0x18,iVar9,prVar1 + 2);
    this = (vector<ride,std::allocator<ride>> *)
           (__return_storage_ptr__->
           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    iVar9._M_current = *(ride **)(this + 0x20);
  }
  else {
    lVar2 = prVar1[2].id;
    lVar3 = prVar1[2].s_time;
    lVar4 = prVar1[2].e_time;
    lVar5 = prVar1[2].len;
    lVar6 = prVar1[2].start.x;
    lVar7 = prVar1[2].start.y;
    lVar8 = prVar1[2].end.y;
    ((iVar9._M_current)->end).x = prVar1[2].end.x;
    ((iVar9._M_current)->end).y = lVar8;
    ((iVar9._M_current)->start).x = lVar6;
    ((iVar9._M_current)->start).y = lVar7;
    (iVar9._M_current)->e_time = lVar4;
    (iVar9._M_current)->len = lVar5;
    (iVar9._M_current)->id = lVar2;
    (iVar9._M_current)->s_time = lVar3;
    iVar9._M_current = (ride *)(*(long *)(this + 0x20) + 0x40);
    *(ride **)(this + 0x20) = iVar9._M_current;
  }
  prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (iVar9._M_current == *(ride **)(this + 0x28)) {
    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
              (this + 0x18,iVar9,prVar1 + 1);
  }
  else {
    lVar2 = prVar1[1].id;
    lVar3 = prVar1[1].s_time;
    lVar4 = prVar1[1].e_time;
    lVar5 = prVar1[1].len;
    lVar6 = prVar1[1].start.x;
    lVar7 = prVar1[1].start.y;
    lVar8 = prVar1[1].end.y;
    ((iVar9._M_current)->end).x = prVar1[1].end.x;
    ((iVar9._M_current)->end).y = lVar8;
    ((iVar9._M_current)->start).x = lVar6;
    ((iVar9._M_current)->start).y = lVar7;
    (iVar9._M_current)->e_time = lVar4;
    (iVar9._M_current)->len = lVar5;
    (iVar9._M_current)->id = lVar2;
    (iVar9._M_current)->s_time = lVar3;
    *(long *)(this + 0x20) = *(long *)(this + 0x20) + 0x40;
  }
  return __return_storage_ptr__;
}

Assistant:

Sol exampleA(const vector<ride>& rides, const long vehs) {
    Sol sol(vehs);

    // Example A:
    sol[0].push_back(rides[0]);
    sol[1].push_back(rides[2]);
    sol[1].push_back(rides[1]);

    return sol;
}